

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::successOrFailColoredStringToStream
          (ConsoleReporter *this,bool success,Enum at,char *success_str)

{
  ostream *poVar1;
  char *pcVar2;
  ostream *poVar3;
  Enum in_EDX;
  byte in_SIL;
  ConsoleReporter *in_RDI;
  undefined4 in_stack_ffffffffffffffc8;
  Enum in_stack_ffffffffffffffcc;
  
  poVar3 = in_RDI->s;
  getSuccessOrFailColor(in_RDI,(bool)(in_SIL & 1),in_EDX);
  poVar1 = Color::operator<<(poVar3,in_stack_ffffffffffffffcc);
  pcVar2 = getSuccessOrFailString
                     (in_RDI,SUB81((ulong)poVar3 >> 0x38,0),(Enum)poVar3,
                      (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  poVar3 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar3,": ");
  return;
}

Assistant:

void successOrFailColoredStringToStream(bool success, assertType::Enum at,
                                                const char* success_str = "SUCCESS") {
            s << getSuccessOrFailColor(success, at)
              << getSuccessOrFailString(success, at, success_str) << ": ";
        }